

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

uintptr_t NodeParamMeta(nodeclass *Class,uint_fast32_t Meta,dataid Id,node *Node)

{
  nodemeta *pnVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uintptr_t *puVar5;
  nodeclass *pnVar6;
  uintptr_t Data;
  char *local_40;
  long local_38;
  
  if (Class != (nodeclass *)0x0) {
    do {
      pnVar1 = Class->Meta;
      if (pnVar1 != (nodemeta *)0x0) {
        uVar4 = *(uint *)pnVar1;
        uVar2 = uVar4 & 0xff;
        if (uVar2 != 0) {
          puVar5 = &pnVar1->Data;
          do {
            if (uVar4 >> 8 == Id) {
              if (uVar2 == Meta) {
                return *puVar5;
              }
              if ((uVar2 == 0x32) &&
                 (lVar3 = (*(code *)*puVar5)(Node,Id,Meta,&local_40), lVar3 != 0)) {
                return (uintptr_t)local_40;
              }
            }
            uVar4 = (uint)puVar5[1];
            puVar5 = puVar5 + 2;
            uVar2 = uVar4 & 0xff;
          } while (uVar2 != 0);
        }
      }
      if (Meta == 0x2c) {
        local_38 = *(long *)(Class + 1);
        for (pnVar6 = Class->ParentClass; lVar3 = local_38, pnVar6 != (nodeclass *)0x0;
            pnVar6 = pnVar6->ParentClass) {
          pnVar1 = pnVar6->Meta;
          if (pnVar1 != (nodemeta *)0x0) {
            uVar4 = *(uint *)pnVar1;
            while ((uVar4 & 0xff) != 0) {
              if ((((uVar4 & 0xff) == 0x32) && (uVar4 >> 8 == Id)) &&
                 (lVar3 = (*(code *)pnVar1->Data)(Node,Id,0x2c,&local_40), lVar3 != 0)) {
                return (uintptr_t)local_40;
              }
              uVar4 = *(uint *)(pnVar1 + 1);
              pnVar1 = pnVar1 + 1;
            }
          }
        }
        if (*(long *)(local_38 + 0xa0) != 0) {
          while ((local_40 = (char *)(**(code **)(lVar3 + 0xa0))
                                               (lVar3,*(undefined4 *)&Class[1].Meta,Id & 0xffffffff)
                 , local_40 == (char *)0x0 || (*local_40 == '\0'))) {
            Class = Class->ParentClass;
            if (Class == (nodeclass *)0x0) {
              return (uintptr_t)"";
            }
          }
          return (uintptr_t)local_40;
        }
      }
      Class = Class->ParentClass;
    } while (Class != (nodeclass *)0x0);
  }
  return 0;
}

Assistant:

static uintptr_t NOINLINE NodeParamMeta(const nodeclass* Class, uint_fast32_t Meta, dataid Id, const node* Node)
{
    uintptr_t Data;
    const nodemeta* m;

    for (;Class;Class=Class->ParentClass)
    {
        if (Class->Meta) // should be registered, just fail safe
            for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
                if (m->Id == Id)
                {
                    if (m->Meta == Meta)
                        return m->Data;
                    if (m->Meta == META_PARAM_META && ((bool_t(*)(const node*,dataid,datameta,uintptr_t*))m->Data)(Node,Id,Meta,&Data))
                        return Data;
                }

        if (Meta == META_PARAM_STRING)
        {
            const nodeclass* MainClass = Class;
            nodecontext* Context = NodeClass_Context(Class);

            // only check for META_PARAM_META...
            while ((Class=Class->ParentClass)!=NULL)
            {
                if (Class->Meta) // should be registered, just fail safe
                    for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
                        if (m->Id == Id && m->Meta == META_PARAM_META && ((bool_t(*)(const node*,dataid,datameta,uintptr_t*))m->Data)(Node,Id,Meta,&Data))
                            return Data;
            }

            Class = MainClass;
            if (Context->ExternalStr)
            {
                do {
                    Data = (uintptr_t)Context->ExternalStr(Context,NodeClass_ClassId(Class),(int)Id);
                    if (Data!=0 && *((const tchar_t*)Data))
                        return Data;
                } while ((Class=Class->ParentClass)!=NULL);
                return (uintptr_t)T("");
            }
        }
    }
    return 0;
}